

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O3

bool tinyobj::LoadObjWithCallback
               (istream *inStream,callback_t *callback,void *user_data,MaterialReader *readMatFn,
               string *warn,string *err)

{
  byte bVar1;
  byte bVar2;
  pointer pcVar3;
  pointer pbVar4;
  pointer pbVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  code *pcVar10;
  iterator iVar11;
  long lVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  undefined8 uVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *elems;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  char escape;
  _Rb_tree_color _Var16;
  index_t *piVar17;
  ulong uVar18;
  ulong uVar19;
  byte *pbVar20;
  byte *pbVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  pointer pbVar23;
  string namebuf;
  vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> indices;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  string linebuf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  vector<const_char_*,_std::allocator<const_char_*>_> names_out;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  index_t idx;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  material_map;
  stringstream errss;
  allocator local_499;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  pointer local_478;
  pointer local_470;
  ios_base *local_468;
  string *local_460;
  index_t *local_458;
  iterator iStack_450;
  index_t *local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  size_type *local_418;
  size_type local_410;
  size_type local_408;
  undefined8 uStack_400;
  undefined1 local_3f8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3d8;
  MaterialReader *local_3c0;
  vector<const_char_*,_std::allocator<const_char_*>_> local_3b8;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> local_398;
  pointer local_378;
  undefined1 local_370 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360 [7];
  ios_base local_2f0 [264];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_1e8;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  local_3c0 = readMatFn;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1e8._M_impl.super__Rb_tree_header._M_header;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_448 = (index_t *)0x0;
  local_458 = (index_t *)0x0;
  iStack_450._M_current = (index_t *)0x0;
  local_398.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_398.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_398.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&local_3d8,2);
  local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3f8._0_8_ = local_3f8 + 0x10;
  local_3f8._8_8_ = 0;
  local_3f8[0x10] = '\0';
  local_468 = local_2f0;
  local_460 = err;
LAB_00151757:
  do {
    paVar22 = &local_498.field_2;
    iVar6 = std::istream::peek();
    if (iVar6 == -1) {
      if (local_460 != (string *)0x0) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (local_460,(char *)local_370._0_8_,local_370._8_8_);
        if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
          operator_delete((void *)local_370._0_8_);
        }
      }
      if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_3f8._0_8_ !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)(local_3f8 + 0x10)) {
        operator_delete((void *)local_3f8._0_8_);
      }
      if ((index_t *)
          local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start != (index_t *)0x0) {
        operator_delete(local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_3d8);
      std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector(&local_398);
      if (local_458 != (index_t *)0x0) {
        operator_delete(local_458);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree(&local_1e8);
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      return true;
    }
    safeGetline(inStream,(string *)local_3f8);
    uVar14 = local_3f8._0_8_;
  } while (local_3f8._8_8_ == 0);
  if (*(char *)(local_3f8._0_8_ + (local_3f8._8_8_ - 1)) == '\n') goto code_r0x00151794;
  goto LAB_001517b0;
code_r0x00151794:
  local_3f8._8_8_ = local_3f8._8_8_ - 1;
  *(char *)(local_3f8._0_8_ + local_3f8._8_8_) = '\0';
  if (local_3f8._8_8_ == 0) goto LAB_00151757;
LAB_001517b0:
  if (*(char *)(local_3f8._0_8_ + (local_3f8._8_8_ - 1)) == '\r') {
    local_3f8._8_8_ = local_3f8._8_8_ - 1;
    *(char *)(local_3f8._0_8_ + local_3f8._8_8_) = '\0';
    if (local_3f8._8_8_ == 0) goto LAB_00151757;
  }
  elems = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_3f8._0_8_;
  sVar9 = strspn((char *)local_3f8._0_8_," \t");
  pbVar20 = (byte *)(uVar14 + sVar9);
  bVar1 = *(byte *)(uVar14 + sVar9);
  if (bVar1 < 0x66) {
    if ((bVar1 == 0) || (bVar1 == 0x23)) goto LAB_00151757;
  }
  else if (bVar1 == 0x66) {
    if ((pbVar20[1] == 0x20) || (pbVar20[1] == 9)) {
      sVar9 = strspn((char *)(pbVar20 + 2)," \t");
      if (iStack_450._M_current != local_458) {
        iStack_450._M_current = local_458;
      }
      pbVar20 = pbVar20 + sVar9 + 2;
      while ((0xd < *pbVar20 || ((0x2401U >> (*pbVar20 & 0x1f) & 1) == 0))) {
        iVar7 = atoi((char *)pbVar20);
        sVar9 = strcspn((char *)pbVar20,"/ \t\r");
        pbVar21 = pbVar20 + sVar9;
        iVar6 = 0;
        if (pbVar20[sVar9] == 0x2f) {
          if (pbVar21[1] == 0x2f) {
            pbVar21 = pbVar21 + 2;
            iVar8 = 0;
          }
          else {
            pbVar20 = pbVar21 + 1;
            iVar8 = atoi((char *)pbVar20);
            sVar9 = strcspn((char *)pbVar20,"/ \t\r");
            pbVar21 = pbVar20 + sVar9;
            if (pbVar20[sVar9] != 0x2f) goto LAB_00151aa3;
            pbVar21 = pbVar21 + 1;
          }
          iVar6 = atoi((char *)pbVar21);
          sVar9 = strcspn((char *)pbVar21,"/ \t\r");
          pbVar21 = pbVar21 + sVar9;
        }
        else {
          iVar8 = 0;
          iVar6 = 0;
        }
LAB_00151aa3:
        local_370._4_4_ = iVar6;
        local_370._0_4_ = iVar7;
        local_370._8_4_ = iVar8;
        if (iStack_450._M_current == local_448) {
          std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
          _M_realloc_insert<tinyobj::index_t_const&>
                    ((vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)&local_458,
                     iStack_450,(index_t *)local_370);
        }
        else {
          (iStack_450._M_current)->texcoord_index = iVar8;
          (iStack_450._M_current)->vertex_index = iVar7;
          (iStack_450._M_current)->normal_index = iVar6;
          iStack_450._M_current = iStack_450._M_current + 1;
        }
        sVar9 = strspn((char *)pbVar21," \t\r");
        pbVar20 = pbVar21 + sVar9;
      }
      pcVar10 = *(code **)(callback + 0x18);
      if ((pcVar10 == (code *)0x0) || ((long)iStack_450._M_current - (long)local_458 == 0))
      goto LAB_00151757;
      uVar18 = ((long)iStack_450._M_current - (long)local_458 >> 2) * -0x5555555555555555;
      piVar17 = local_458;
      goto LAB_00151b45;
    }
  }
  else if (bVar1 == 0x76) {
    bVar2 = pbVar20[1];
    if (bVar2 < 0x6e) {
      if ((bVar2 == 9) || (bVar2 == 0x20)) {
        sVar9 = strspn((char *)(pbVar20 + 2)," \t");
        pbVar20 = pbVar20 + sVar9 + 2;
        sVar9 = strcspn((char *)pbVar20," \t\r");
        pbVar21 = pbVar20 + sVar9;
        local_370._0_8_ = (pointer)0x0;
        tryParseDouble((char *)pbVar20,(char *)pbVar21,(double *)local_370);
        local_470 = (pointer)local_370._0_8_;
        sVar9 = strspn((char *)pbVar21," \t");
        pbVar21 = pbVar21 + sVar9;
        sVar9 = strcspn((char *)pbVar21," \t\r");
        pbVar20 = pbVar21 + sVar9;
        local_370._0_8_ = (pointer)0x0;
        tryParseDouble((char *)pbVar21,(char *)pbVar20,(double *)local_370);
        local_478 = (pointer)local_370._0_8_;
        sVar9 = strspn((char *)pbVar20," \t");
        pbVar20 = pbVar20 + sVar9;
        sVar9 = strcspn((char *)pbVar20," \t\r");
        pbVar21 = pbVar20 + sVar9;
        local_370._0_8_ = (pointer)0x0;
        tryParseDouble((char *)pbVar20,(char *)pbVar21,(double *)local_370);
        local_378 = (pointer)local_370._0_8_;
        sVar9 = strspn((char *)pbVar21," \t");
        pbVar21 = pbVar21 + sVar9;
        sVar9 = strcspn((char *)pbVar21," \t\r");
        local_370._0_8_ = (char *)0x3ff0000000000000;
        tryParseDouble((char *)pbVar21,(char *)(pbVar21 + sVar9),(double *)local_370);
        if (*(code **)callback != (code *)0x0) {
          (**(code **)callback)
                    ((float)(double)local_470,(float)(double)local_478,(float)(double)local_378,
                     (float)(double)local_370._0_8_,user_data);
        }
        goto LAB_00151757;
      }
    }
    else if (bVar2 == 0x6e) {
      if ((pbVar20[2] == 0x20) || (pbVar20[2] == 9)) {
        sVar9 = strspn((char *)(pbVar20 + 3)," \t");
        pbVar20 = pbVar20 + sVar9 + 3;
        sVar9 = strcspn((char *)pbVar20," \t\r");
        pbVar21 = pbVar20 + sVar9;
        local_370._0_8_ = (pointer)0x0;
        tryParseDouble((char *)pbVar20,(char *)pbVar21,(double *)local_370);
        local_470 = (pointer)local_370._0_8_;
        sVar9 = strspn((char *)pbVar21," \t");
        pbVar21 = pbVar21 + sVar9;
        sVar9 = strcspn((char *)pbVar21," \t\r");
        pbVar20 = pbVar21 + sVar9;
        local_370._0_8_ = (pointer)0x0;
        tryParseDouble((char *)pbVar21,(char *)pbVar20,(double *)local_370);
        local_478 = (pointer)local_370._0_8_;
        sVar9 = strspn((char *)pbVar20," \t");
        pbVar20 = pbVar20 + sVar9;
        sVar9 = strcspn((char *)pbVar20," \t\r");
        local_370._0_8_ = (char *)0x0;
        tryParseDouble((char *)pbVar20,(char *)(pbVar20 + sVar9),(double *)local_370);
        if (*(code **)(callback + 8) != (code *)0x0) {
          (**(code **)(callback + 8))
                    ((float)(double)local_470,(float)(double)local_478,
                     (float)(double)local_370._0_8_,user_data);
        }
        goto LAB_00151757;
      }
    }
    else if ((bVar2 == 0x74) && ((pbVar20[2] == 0x20 || (pbVar20[2] == 9)))) {
      sVar9 = strspn((char *)(pbVar20 + 3)," \t");
      pbVar20 = pbVar20 + sVar9 + 3;
      sVar9 = strcspn((char *)pbVar20," \t\r");
      pbVar21 = pbVar20 + sVar9;
      local_370._0_8_ = (pointer)0x0;
      tryParseDouble((char *)pbVar20,(char *)pbVar21,(double *)local_370);
      local_470 = (pointer)local_370._0_8_;
      sVar9 = strspn((char *)pbVar21," \t");
      pbVar21 = pbVar21 + sVar9;
      sVar9 = strcspn((char *)pbVar21," \t\r");
      pbVar20 = pbVar21 + sVar9;
      local_370._0_8_ = (pointer)0x0;
      tryParseDouble((char *)pbVar21,(char *)pbVar20,(double *)local_370);
      local_478 = (pointer)local_370._0_8_;
      sVar9 = strspn((char *)pbVar20," \t");
      pbVar20 = pbVar20 + sVar9;
      sVar9 = strcspn((char *)pbVar20," \t\r");
      local_370._0_8_ = (char *)0x0;
      tryParseDouble((char *)pbVar20,(char *)(pbVar20 + sVar9),(double *)local_370);
      if (*(code **)(callback + 0x10) != (code *)0x0) {
        (**(code **)(callback + 0x10))
                  ((float)(double)local_470,(float)(double)local_478,(float)(double)local_370._0_8_,
                   user_data);
      }
      goto LAB_00151757;
    }
  }
  iVar6 = strncmp((char *)pbVar20,"usemtl",6);
  if ((iVar6 != 0) || ((pbVar20[6] != 0x20 && (pbVar20[6] != 9)))) {
    iVar6 = strncmp((char *)pbVar20,"mtllib",6);
    pbVar5 = local_3d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar4 = local_3d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((iVar6 == 0) && ((pbVar20[6] == 0x20 || (pbVar20[6] == 9)))) {
      if (local_3c0 != (MaterialReader *)0x0) {
        local_438._M_dataplus._M_p = (pointer)0x0;
        local_438._M_string_length = 0;
        local_438.field_2._M_allocated_capacity = 0;
        std::__cxx11::string::string
                  ((string *)local_370,(char *)(pbVar20 + 7),(allocator *)&local_498);
        SplitString((string *)local_370,(char)&local_438,escape,elems);
        if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
          operator_delete((void *)local_370._0_8_);
        }
        if (local_438._M_dataplus._M_p == (pointer)local_438._M_string_length) {
          if (warn != (string *)0x0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (warn,"Looks like empty filename for mtllib. Use default material. \n");
          }
        }
        else {
          lVar12 = 0;
          uVar18 = 0;
          do {
            local_370._0_8_ = local_370 + 0x10;
            local_370._8_8_ = 0;
            local_360[0]._M_local_buf[0] = '\0';
            local_498._M_string_length = 0;
            local_498.field_2._M_local_buf[0] = '\0';
            local_498._M_dataplus._M_p = (pointer)paVar22;
            std::__cxx11::string::string
                      ((string *)&local_418,*(char **)(local_438._M_dataplus._M_p + lVar12),
                       &local_499);
            iVar6 = (*local_3c0->_vptr_MaterialReader[2])
                              (local_3c0,(string *)&local_418,&local_398,&local_1e8,local_370,
                               &local_498);
            if (local_418 != &local_408) {
              operator_delete(local_418);
            }
            if ((warn != (string *)0x0) && (local_370._8_8_ != 0)) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(warn,(char *)local_370._0_8_,local_370._8_8_);
            }
            if ((local_460 !=
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
               (local_498._M_string_length != 0)) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(local_460,local_498._M_dataplus._M_p,local_498._M_string_length);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._M_dataplus._M_p != paVar22) {
              operator_delete(local_498._M_dataplus._M_p);
            }
            if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
              operator_delete((void *)local_370._0_8_);
            }
            if ((char)iVar6 != '\0') {
              if (*(code **)(callback + 0x28) == (code *)0x0) goto LAB_001523b8;
              if (local_398.
                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_398.
                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                  _M_impl.super__Vector_impl_data._M_start) goto LAB_00152589;
              (**(code **)(callback + 0x28))
                        (user_data,
                         local_398.
                         super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         ((long)local_398.
                                super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_398.
                                super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x63fb9aeb1fdcd759
                        );
              goto LAB_001523b8;
            }
            uVar18 = uVar18 + 1;
            lVar12 = lVar12 + 0x20;
          } while (uVar18 < (ulong)((long)(local_438._M_string_length -
                                          (long)local_438._M_dataplus._M_p) >> 5));
          if (warn != (string *)0x0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (warn,"Failed to load material file(s). Use default material.\n");
          }
        }
LAB_001523b8:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_438);
      }
      goto LAB_00151757;
    }
    if (bVar1 != 0x6f) {
      if ((bVar1 != 0x67) || ((pbVar20[1] != 0x20 && (pbVar20[1] != 9)))) goto LAB_00151757;
      pbVar23 = local_3d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_3d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_3d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        do {
          pcVar3 = (pbVar23->_M_dataplus)._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3 != &pbVar23->field_2) {
            operator_delete(pcVar3);
          }
          pbVar23 = pbVar23 + 1;
        } while (pbVar23 != pbVar5);
        local_3d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
      }
      while( true ) {
        if ((*pbVar20 < 0xe) && ((0x2401U >> (*pbVar20 & 0x1f) & 1) != 0)) break;
        local_498._M_string_length = 0;
        local_498.field_2._M_local_buf[0] = '\0';
        local_498._M_dataplus._M_p = (pointer)paVar22;
        sVar9 = strspn((char *)pbVar20," \t");
        pbVar20 = pbVar20 + sVar9;
        sVar9 = strcspn((char *)pbVar20," \t\r");
        pbVar21 = pbVar20 + sVar9;
        local_370._0_8_ = local_370 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_370,pbVar20,pbVar21);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_498,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370);
        if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
          operator_delete((void *)local_370._0_8_);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_3d8,&local_498);
        sVar9 = strspn((char *)pbVar21," \t\r");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != paVar22) {
          operator_delete(local_498._M_dataplus._M_p);
        }
        pbVar20 = pbVar21 + sVar9;
      }
      if (*(code **)(callback + 0x30) == (code *)0x0) goto LAB_00151757;
      uVar18 = (long)local_3d8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_3d8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      if (uVar18 < 2) {
        (**(code **)(callback + 0x30))(user_data,0,0);
        goto LAB_00151757;
      }
      std::vector<const_char_*,_std::allocator<const_char_*>_>::resize(&local_3b8,uVar18 - 1);
      if (local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar18 = 0;
      }
      else {
        lVar12 = 0x20;
        uVar19 = 0;
        do {
          *(undefined8 *)
           ((int *)local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                   .super__Vector_impl_data._M_start + uVar19 * 2) =
               *(undefined8 *)
                ((long)&((local_3d8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar12);
          uVar19 = uVar19 + 1;
          uVar18 = (long)local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3;
          lVar12 = lVar12 + 0x20;
        } while (uVar19 < uVar18);
      }
      if (local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
                   uVar18);
LAB_00152589:
        uVar14 = std::__throw_out_of_range_fmt
                           ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            ,0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_438);
        if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3f8._0_8_ !=
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_3f8 + 0x10)) {
          operator_delete((void *)local_3f8._0_8_);
        }
        if ((index_t *)
            local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start != (index_t *)0x0) {
          operator_delete(local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_3d8);
        std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector(&local_398);
        if (local_458 != (index_t *)0x0) {
          operator_delete(local_458);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ::~_Rb_tree(&local_1e8);
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
        _Unwind_Resume(uVar14);
      }
      pcVar10 = *(code **)(callback + 0x30);
      piVar17 = (index_t *)
                local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start;
LAB_00151b45:
      (*pcVar10)(user_data,piVar17,uVar18);
      goto LAB_00151757;
    }
    if ((pbVar20[1] != 0x20) && (pbVar20[1] != 9)) goto LAB_00151757;
    std::__cxx11::stringstream::stringstream((stringstream *)local_370);
    sVar9 = strlen((char *)(pbVar20 + 2));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_370 + 0x10),(char *)(pbVar20 + 2),sVar9);
    std::__cxx11::stringbuf::str();
    if (*(code **)(callback + 0x38) != (code *)0x0) {
      (**(code **)(callback + 0x38))(user_data,local_498._M_dataplus._M_p);
    }
    goto LAB_0015244a;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_370);
  sVar9 = strlen((char *)(pbVar20 + 7));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_370 + 0x10),(char *)(pbVar20 + 7),sVar9);
  std::__cxx11::stringbuf::str();
  iVar11 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::find(&local_1e8,&local_498);
  if ((_Rb_tree_header *)iVar11._M_node == &local_1e8._M_impl.super__Rb_tree_header) {
    pcVar10 = *(code **)(callback + 0x20);
    if (pcVar10 == (code *)0x0 && warn != (string *)0x0) {
      std::operator+(&local_438,"material [ ",&local_498);
      pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_438," ] not found in .mtl\n");
      local_418 = (size_type *)(pbVar13->_M_dataplus)._M_p;
      paVar15 = &pbVar13->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418 == paVar15) {
        local_408 = paVar15->_M_allocated_capacity;
        uStack_400 = *(undefined8 *)((long)&pbVar13->field_2 + 8);
        local_418 = &local_408;
      }
      else {
        local_408 = paVar15->_M_allocated_capacity;
      }
      local_410 = pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar15;
      pbVar13->_M_string_length = 0;
      (pbVar13->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (warn,(char *)local_418,local_410);
      if (local_418 != &local_408) {
        operator_delete(local_418);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p);
      }
      _Var16 = ~_S_red;
      goto LAB_00152431;
    }
    _Var16 = ~_S_red;
  }
  else {
    _Var16 = iVar11._M_node[2]._M_color;
LAB_00152431:
    pcVar10 = *(code **)(callback + 0x20);
  }
  if (pcVar10 != (code *)0x0) {
    (*pcVar10)(user_data,local_498._M_dataplus._M_p,_Var16);
  }
LAB_0015244a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != paVar22) {
    operator_delete(local_498._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_370);
  std::ios_base::~ios_base(local_468);
  goto LAB_00151757;
}

Assistant:

bool LoadObjWithCallback(std::istream &inStream, const callback_t &callback,
                         void *user_data /*= NULL*/,
                         MaterialReader *readMatFn /*= NULL*/,
                         std::string *warn, /* = NULL*/
                         std::string *err /*= NULL*/) {
  std::stringstream errss;

  // material
  std::map<std::string, int> material_map;
  int material_id = -1;  // -1 = invalid

  std::vector<index_t> indices;
  std::vector<material_t> materials;
  std::vector<std::string> names;
  names.reserve(2);
  std::vector<const char *> names_out;

  std::string linebuf;
  while (inStream.peek() != -1) {
    safeGetline(inStream, linebuf);

    // Trim newline '\r\n' or '\n'
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\n')
        linebuf.erase(linebuf.size() - 1);
    }
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\r')
        linebuf.erase(linebuf.size() - 1);
    }

    // Skip if empty line.
    if (linebuf.empty()) {
      continue;
    }

    // Skip leading space.
    const char *token = linebuf.c_str();
    token += strspn(token, " \t");

    assert(token);
    if (token[0] == '\0') continue;  // empty line

    if (token[0] == '#') continue;  // comment line

    // vertex
    if (token[0] == 'v' && IS_SPACE((token[1]))) {
      token += 2;
      // TODO(syoyo): Support parsing vertex color extension.
      real_t x, y, z, w;  // w is optional. default = 1.0
      parseV(&x, &y, &z, &w, &token);
      if (callback.vertex_cb) {
        callback.vertex_cb(user_data, x, y, z, w);
      }
      continue;
    }

    // normal
    if (token[0] == 'v' && token[1] == 'n' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y, z;
      parseReal3(&x, &y, &z, &token);
      if (callback.normal_cb) {
        callback.normal_cb(user_data, x, y, z);
      }
      continue;
    }

    // texcoord
    if (token[0] == 'v' && token[1] == 't' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y, z;  // y and z are optional. default = 0.0
      parseReal3(&x, &y, &z, &token);
      if (callback.texcoord_cb) {
        callback.texcoord_cb(user_data, x, y, z);
      }
      continue;
    }

    // face
    if (token[0] == 'f' && IS_SPACE((token[1]))) {
      token += 2;
      token += strspn(token, " \t");

      indices.clear();
      while (!IS_NEW_LINE(token[0])) {
        vertex_index_t vi = parseRawTriple(&token);

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        indices.push_back(idx);
        size_t n = strspn(token, " \t\r");
        token += n;
      }

      if (callback.index_cb && indices.size() > 0) {
        callback.index_cb(user_data, &indices.at(0),
                          static_cast<int>(indices.size()));
      }

      continue;
    }

    // use mtl
    if ((0 == strncmp(token, "usemtl", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      std::stringstream ss;
      ss << token;
      std::string namebuf = ss.str();

      int newMaterialId = -1;
      std::map<std::string, int>::const_iterator it = material_map.find(namebuf);
      if (it != material_map.end()) {
        newMaterialId = it->second;
      } else {
        // { warn!! material not found }
        if (warn && (!callback.usemtl_cb)) {
          (*warn) += "material [ " + namebuf + " ] not found in .mtl\n";
        }
      }

      if (newMaterialId != material_id) {
        material_id = newMaterialId;
      }

      if (callback.usemtl_cb) {
        callback.usemtl_cb(user_data, namebuf.c_str(), material_id);
      }

      continue;
    }

    // load mtl
    if ((0 == strncmp(token, "mtllib", 6)) && IS_SPACE((token[6]))) {
      if (readMatFn) {
        token += 7;

        std::vector<std::string> filenames;
        SplitString(std::string(token), ' ', '\\', filenames);

        if (filenames.empty()) {
          if (warn) {
            (*warn) +=
                "Looks like empty filename for mtllib. Use default "
                "material. \n";
          }
        } else {
          bool found = false;
          for (size_t s = 0; s < filenames.size(); s++) {
            std::string warn_mtl;
            std::string err_mtl;
            bool ok = (*readMatFn)(filenames[s].c_str(), &materials,
                                   &material_map, &warn_mtl, &err_mtl);

            if (warn && (!warn_mtl.empty())) {
              (*warn) += warn_mtl;  // This should be warn message.
            }

            if (err && (!err_mtl.empty())) {
              (*err) += err_mtl;
            }

            if (ok) {
              found = true;
              break;
            }
          }

          if (!found) {
            if (warn) {
              (*warn) +=
                  "Failed to load material file(s). Use default "
                  "material.\n";
            }
          } else {
            if (callback.mtllib_cb) {
              callback.mtllib_cb(user_data, &materials.at(0),
                                 static_cast<int>(materials.size()));
            }
          }
        }
      }

      continue;
    }

    // group name
    if (token[0] == 'g' && IS_SPACE((token[1]))) {
      names.clear();

      while (!IS_NEW_LINE(token[0])) {
        std::string str = parseString(&token);
        names.push_back(str);
        token += strspn(token, " \t\r");  // skip tag
      }

      assert(names.size() > 0);

      if (callback.group_cb) {
        if (names.size() > 1) {
          // create const char* array.
          names_out.resize(names.size() - 1);
          for (size_t j = 0; j < names_out.size(); j++) {
            names_out[j] = names[j + 1].c_str();
          }
          callback.group_cb(user_data, &names_out.at(0),
                            static_cast<int>(names_out.size()));

        } else {
          callback.group_cb(user_data, NULL, 0);
        }
      }

      continue;
    }

    // object name
    if (token[0] == 'o' && IS_SPACE((token[1]))) {
      // @todo { multiple object name? }
      token += 2;

      std::stringstream ss;
      ss << token;
      std::string object_name = ss.str();

      if (callback.object_cb) {
        callback.object_cb(user_data, object_name.c_str());
      }

      continue;
    }

#if 0  // @todo
    if (token[0] == 't' && IS_SPACE(token[1])) {
      tag_t tag;

      token += 2;
      std::stringstream ss;
      ss << token;
      tag.name = ss.str();

      token += tag.name.size() + 1;

      tag_sizes ts = parseTagTriple(&token);

      tag.intValues.resize(static_cast<size_t>(ts.num_ints));

      for (size_t i = 0; i < static_cast<size_t>(ts.num_ints); ++i) {
        tag.intValues[i] = atoi(token);
        token += strcspn(token, "/ \t\r") + 1;
      }

      tag.floatValues.resize(static_cast<size_t>(ts.num_reals));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_reals); ++i) {
        tag.floatValues[i] = parseReal(&token);
        token += strcspn(token, "/ \t\r") + 1;
      }

      tag.stringValues.resize(static_cast<size_t>(ts.num_strings));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_strings); ++i) {
        std::stringstream ss;
        ss << token;
        tag.stringValues[i] = ss.str();
        token += tag.stringValues[i].size() + 1;
      }

      tags.push_back(tag);
    }
#endif

    // Ignore unknown command.
  }

  if (err) {
    (*err) += errss.str();
  }

  return true;
}